

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O2

ExecValueAccess __thiscall
rsg::ExecutionContext::getValue(ExecutionContext *this,Variable *variable)

{
  mapped_type *ppVVar1;
  mapped_type this_00;
  ExecValueAccess EVar2;
  Variable *variable_local;
  
  variable_local = variable;
  ppVVar1 = std::
            map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
            ::operator[](&this->m_varValues,&variable_local);
  this_00 = *ppVVar1;
  if (this_00 == (mapped_type)0x0) {
    this_00 = (mapped_type)operator_new(0x18);
    ValueStorage<64>::ValueStorage(this_00,&variable_local->m_type);
    ppVVar1 = std::
              map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
              ::operator[](&this->m_varValues,&variable_local);
    *ppVVar1 = this_00;
  }
  EVar2.super_ConstStridedValueAccess<64>.m_value =
       (this_00->m_value).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start;
  EVar2.super_ConstStridedValueAccess<64>.m_type = &variable_local->m_type;
  return (ExecValueAccess)EVar2.super_ConstStridedValueAccess<64>;
}

Assistant:

ExecValueAccess ExecutionContext::getValue (const Variable* variable)
{
	ExecValueStorage* storage = m_varValues[variable];

	if (!storage)
	{
		storage = new ExecValueStorage(variable->getType());
		m_varValues[variable] = storage;
	}

	return storage->getValue(variable->getType());
}